

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_NlsLSetup(int jbad,int *jcur,void *arkode_mem)

{
  int iVar1;
  undefined4 *in_RSI;
  int in_EDI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_4;
  
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                       ,(ARKodeARKStepMem *)0xedf6cd);
  if (local_4 == 0) {
    if (in_EDI != 0) {
      *(undefined4 *)(local_28 + 0xfc) = 1;
    }
    *(long *)(local_28 + 0x180) = *(long *)(local_28 + 0x180) + 1;
    iVar1 = (**(code **)(local_28 + 0x110))
                      (*(undefined8 *)(local_20 + 0x198),local_20,*(undefined4 *)(local_28 + 0xfc),
                       *(undefined8 *)(local_20 + 0x108),
                       *(undefined8 *)
                        (*(long *)(local_28 + 0x30) + (long)*(int *)(local_28 + 0x58) * 8),
                       local_28 + 0x100,*(undefined8 *)(local_20 + 0x120),
                       *(undefined8 *)(local_20 + 0x128),*(undefined8 *)(local_20 + 0x130));
    *in_RSI = *(undefined4 *)(local_28 + 0x100);
    *(undefined4 *)(local_20 + 0x25c) = 0;
    *(undefined8 *)(local_28 + 200) = 0x3ff0000000000000;
    *(undefined8 *)(local_28 + 0xa0) = 0x3ff0000000000000;
    *(undefined8 *)(local_28 + 0x98) = *(undefined8 *)(local_28 + 0x90);
    *(undefined8 *)(local_28 + 0xf0) = *(undefined8 *)(local_20 + 0x1d8);
    if (iVar1 < 0) {
      local_4 = -6;
    }
    else if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_4 = 4;
    }
  }
  return local_4;
}

Assistant:

int arkStep_NlsLSetup(booleantype jbad, booleantype* jcur, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_NlsLSetup",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update convfail based on jbad flag */
  if (jbad)  step_mem->convfail = ARK_FAIL_BAD_J;

  /* Use ARKode's tempv1, tempv2 and tempv3 as
     temporary vectors for the linear solver setup routine */
  step_mem->nsetups++;
  retval = step_mem->lsetup(ark_mem, step_mem->convfail, ark_mem->tcur,
                            ark_mem->ycur, step_mem->Fi[step_mem->istage],
                            &(step_mem->jcur), ark_mem->tempv1,
                            ark_mem->tempv2, ark_mem->tempv3);

  /* update Jacobian status */
  *jcur = step_mem->jcur;

  /* update flags and 'gamma' values for last lsetup call */
  ark_mem->firststage = SUNFALSE;
  step_mem->gamrat = step_mem->crate = ONE;
  step_mem->gammap = step_mem->gamma;
  step_mem->nstlp  = ark_mem->nst;

  if (retval < 0) return(ARK_LSETUP_FAIL);
  if (retval > 0) return(CONV_FAIL);

  return(ARK_SUCCESS);
}